

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

bool __thiscall QWidgetWindow::updateSize(QWidgetWindow *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  QSize QVar4;
  undefined1 auVar5 [16];
  
  bVar3 = QWidget::testAttribute_helper((QWidget *)(this->m_widget).wp.value,WA_OutsideWSRange);
  if ((!bVar3) &&
     (bVar3 = QWidget::testAttribute_helper
                        ((QWidget *)(this->m_widget).wp.value,WA_DontShowOnScreen), !bVar3)) {
    QVar4 = QRect::size((QRect *)(*(long *)((this->m_widget).wp.value + 0x20) + 0x14));
    auVar5 = QWindow::geometry();
    bVar3 = (auVar5._12_4_ - auVar5._4_4_) + 1 != QVar4.ht.m_i.m_i;
    bVar2 = (auVar5._8_4_ - auVar5._0_4_) + 1 != QVar4.wd.m_i.m_i;
    if (bVar3 || bVar2) {
      lVar1 = *(long *)((this->m_widget).wp.value + 0x20);
      auVar5 = QWindow::geometry();
      *(int *)(lVar1 + 0x1c) = (auVar5._8_4_ - auVar5._0_4_) + *(int *)(lVar1 + 0x14);
      *(int *)(lVar1 + 0x20) = (auVar5._12_4_ - auVar5._4_4_) + *(int *)(lVar1 + 0x18);
    }
    updateMargins(this);
    return bVar3 || bVar2;
  }
  return false;
}

Assistant:

bool QWidgetWindow::updateSize()
{
    bool changed = false;
    if (m_widget->testAttribute(Qt::WA_OutsideWSRange))
        return changed;
    if (m_widget->testAttribute(Qt::WA_DontShowOnScreen))
        return changed;

    if (m_widget->data->crect.size() != geometry().size()) {
        changed = true;
        m_widget->data->crect.setSize(geometry().size());
    }

    updateMargins();
    return changed;
}